

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_texops(Context *ctx,char *opcode,int dims,int texbem)

{
  int iVar1;
  
  if ((ctx->dest_arg).regtype != REG_TYPE_ADDRESS) {
    failf(ctx,"%s destination must be a texture register",opcode);
  }
  if (ctx->source_args[0].regtype != REG_TYPE_ADDRESS) {
    failf(ctx,"%s source must be a texture register",opcode);
  }
  iVar1 = (ctx->dest_arg).regnum;
  if (iVar1 <= ctx->source_args[0].regnum) {
    failf(ctx,"%s dest must be a higher register than source",opcode);
    iVar1 = (ctx->dest_arg).regnum;
  }
  if (dims != 0) {
    add_sampler(ctx,iVar1,dims == 2 ^ TEXTURE_TYPE_CUBE,texbem);
    iVar1 = (ctx->dest_arg).regnum;
  }
  add_attribute_register(ctx,REG_TYPE_ADDRESS,iVar1,MOJOSHADER_USAGE_TEXCOORD,iVar1,0xf,0);
  iVar1 = ctx->source_args[0].regnum;
  add_attribute_register(ctx,REG_TYPE_ADDRESS,iVar1,MOJOSHADER_USAGE_TEXCOORD,iVar1,0xf,0);
  return;
}

Assistant:

static void state_texops(Context *ctx, const char *opcode,
                         const int dims, const int texbem)
{
    const DestArgInfo *dst = &ctx->dest_arg;
    const SourceArgInfo *src = &ctx->source_args[0];
    if (dst->regtype != REG_TYPE_TEXTURE)
        failf(ctx, "%s destination must be a texture register", opcode);
    if (src->regtype != REG_TYPE_TEXTURE)
        failf(ctx, "%s source must be a texture register", opcode);
    if (src->regnum >= dst->regnum)  // so says MSDN.
        failf(ctx, "%s dest must be a higher register than source", opcode);

    if (dims)
    {
        TextureType ttyp = (dims == 2) ? TEXTURE_TYPE_2D : TEXTURE_TYPE_CUBE;
        add_sampler(ctx, dst->regnum, ttyp, texbem);
    } // if

    add_attribute_register(ctx, REG_TYPE_TEXTURE, dst->regnum,
                           MOJOSHADER_USAGE_TEXCOORD, dst->regnum, 0xF, 0);

    // Strictly speaking, there should be a TEX opcode prior to this call that
    //  should fill in this metadata, but I'm not sure that's required for the
    //  shader to assemble in D3D, so we'll do this so we don't fail with a
    //  cryptic error message even if the developer didn't do the TEX.
    add_attribute_register(ctx, REG_TYPE_TEXTURE, src->regnum,
                           MOJOSHADER_USAGE_TEXCOORD, src->regnum, 0xF, 0);
}